

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxTypeCheck::EmitCommon(FxTypeCheck *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int opcode;
  ExpEmit local_30;
  ExpEmit casttype;
  ExpEmit castee;
  VMFunctionBuilder *build_local;
  FxTypeCheck *this_local;
  ExpEmit ares;
  
  casttype._0_4_ = (*this->left->_vptr_FxExpression[9])(this->left,build);
  casttype.Konst = (bool)(char)extraout_var;
  casttype.Fixed = (bool)(char)((uint)extraout_var >> 8);
  casttype.Final = (bool)(char)((uint)extraout_var >> 0x10);
  casttype.Target = (bool)(char)((uint)extraout_var >> 0x18);
  local_30._0_4_ = (*this->right->_vptr_FxExpression[9])(this->right,build);
  local_30.Konst = (bool)(char)extraout_var_00;
  local_30.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
  local_30.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
  local_30.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
  ExpEmit::Free(&casttype,build);
  ExpEmit::Free(&local_30,build);
  ExpEmit::ExpEmit((ExpEmit *)&this_local,build,3,1);
  opcode = 0x40;
  if (((ulong)local_30 & 0x100000000) != 0) {
    opcode = 0x41;
  }
  VMFunctionBuilder::Emit
            (build,opcode,(uint)(ushort)this_local,(uint)casttype.RegNum,(uint)local_30.RegNum);
  EVar1.RegType = this_local._2_1_;
  EVar1.RegCount = this_local._3_1_;
  EVar1.Konst = (bool)this_local._4_1_;
  EVar1.Fixed = (bool)this_local._5_1_;
  EVar1.Final = (bool)this_local._6_1_;
  EVar1.Target = (bool)this_local._7_1_;
  EVar1.RegNum = (ushort)this_local;
  return EVar1;
}

Assistant:

ExpEmit FxTypeCheck::EmitCommon(VMFunctionBuilder *build)
{
	ExpEmit castee = left->Emit(build);
	ExpEmit casttype = right->Emit(build);
	castee.Free(build);
	casttype.Free(build);
	ExpEmit ares(build, REGT_POINTER);
	build->Emit(casttype.Konst ? OP_DYNCAST_K : OP_DYNCAST_R, ares.RegNum, castee.RegNum, casttype.RegNum);
	return ares;
}